

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_pivotref.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundPivotRef *ref)

{
  Binder *ref_00;
  long in_RDX;
  undefined1 local_30 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  ref_00 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x20));
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             (in_RDX + 0x30));
  CreatePlan((Binder *)local_30,(BoundTableRef *)ref_00);
  make_uniq<duckdb::LogicalPivot,unsigned_long&,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::BoundPivotInfo>
            ((duckdb *)&local_28,(unsigned_long *)(in_RDX + 0x18),
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)local_30,(BoundPivotInfo *)(in_RDX + 0x38));
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28._M_pi;
  if (local_30 != (undefined1  [8])0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((((enable_shared_from_this<duckdb::Binder> *)local_30)->__weak_this_).
                        internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi)
              ();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundPivotRef &ref) {
	auto subquery = ref.child_binder->CreatePlan(*ref.child);

	auto result = make_uniq<LogicalPivot>(ref.bind_index, std::move(subquery), std::move(ref.bound_pivot));
	return std::move(result);
}